

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

int32_t mm256_accumulate_epi32(__m256i vec_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  __m128i vtmp2;
  __m128i vtmp1;
  undefined1 local_110 [16];
  undefined4 local_50;
  
  auVar1._8_8_ = in_register_00001218;
  auVar1._0_8_ = in_YMM0_H;
  auVar1 = vpaddd_avx(local_110,auVar1);
  auVar2 = vpsrldq_avx(auVar1,8);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  auVar2 = vpsrldq_avx(auVar1,4);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  local_50 = auVar1._0_4_;
  return local_50;
}

Assistant:

static inline int32_t mm256_accumulate_epi32(__m256i vec_a) {
  __m128i vtmp1 = _mm256_extracti128_si256(vec_a, 1);
  __m128i vtmp2 = _mm256_castsi256_si128(vec_a);
  vtmp1 = _mm_add_epi32(vtmp1, vtmp2);
  vtmp2 = _mm_srli_si128(vtmp1, 8);
  vtmp1 = _mm_add_epi32(vtmp1, vtmp2);
  vtmp2 = _mm_srli_si128(vtmp1, 4);
  vtmp1 = _mm_add_epi32(vtmp1, vtmp2);
  return _mm_cvtsi128_si32(vtmp1);
}